

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

bool xercesc_4_0::XMLUri::isWellFormedAddress(XMLCh *addrString,MemoryManager *manager)

{
  bool bVar1;
  int iVar2;
  XMLSize_t length;
  undefined4 extraout_var;
  ulong local_48;
  XMLSize_t i;
  uint labelCharCount;
  XMLCh *tmp2;
  int lastPeriodPos;
  XMLSize_t addrStrLen;
  MemoryManager *manager_local;
  XMLCh *addrString_local;
  XMLCh *targetStr;
  
  if ((addrString == (XMLCh *)0x0) || (*addrString == L'\0')) {
    addrString_local._7_1_ = false;
  }
  else {
    length = XMLString::stringLen(addrString);
    if (*addrString == L'[') {
      addrString_local._7_1_ = isWellFormedIPv6Reference(addrString,length);
    }
    else if (((*addrString == L'.') || (*addrString == L'-')) || (addrString[length - 1] == L'-')) {
      addrString_local._7_1_ = false;
    }
    else {
      tmp2._4_4_ = XMLString::lastIndexOf(addrString,L'.');
      if ((long)(tmp2._4_4_ + 1) == length) {
        iVar2 = (*manager->_vptr_MemoryManager[3])(manager,length << 1);
        targetStr = (XMLCh *)CONCAT44(extraout_var,iVar2);
        XMLString::subString(targetStr,addrString,0,(long)tmp2._4_4_,manager);
        tmp2._4_4_ = XMLString::lastIndexOf(targetStr,L'.');
        (*manager->_vptr_MemoryManager[4])(manager,targetStr);
        bVar1 = XMLString::isDigit(addrString[tmp2._4_4_ + 1]);
        if (bVar1) {
          return false;
        }
      }
      bVar1 = XMLString::isDigit(addrString[tmp2._4_4_ + 1]);
      if (bVar1) {
        addrString_local._7_1_ = isWellFormedIPv4Address(addrString,length);
      }
      else if (length < 0x100) {
        i._4_4_ = 0;
        for (local_48 = 0; local_48 < length; local_48 = local_48 + 1) {
          if (addrString[local_48] == L'.') {
            if (((local_48 != 0) &&
                (bVar1 = XMLString::isAlphaNum(addrString[local_48 - 1]), !bVar1)) ||
               ((local_48 + 1 < length &&
                (bVar1 = XMLString::isAlphaNum(addrString[local_48 + 1]), !bVar1)))) {
              return false;
            }
            i._4_4_ = 0;
          }
          else {
            bVar1 = XMLString::isAlphaNum(addrString[local_48]);
            if ((!bVar1) && (addrString[local_48] != L'-')) {
              return false;
            }
            i._4_4_ = i._4_4_ + 1;
            if (0x3f < i._4_4_) {
              return false;
            }
          }
        }
        addrString_local._7_1_ = true;
      }
      else {
        addrString_local._7_1_ = false;
      }
    }
  }
  return addrString_local._7_1_;
}

Assistant:

bool XMLUri::isWellFormedAddress(const XMLCh* const addrString
                                 , MemoryManager* const manager)
{
    // Check that we have a non-zero length string.
    if (!addrString || !*addrString)
        return false;

    // Get address length.
    XMLSize_t addrStrLen = XMLString::stringLen(addrString);

    // Check if the host is a valid IPv6reference.
    if (*addrString == chOpenSquare)
    {
        return isWellFormedIPv6Reference(addrString, addrStrLen);
    }

    //
    // Cannot start with a '.', '-', or end with a '-'.
    //
    if (*addrString == chPeriod ||
        *addrString == chDash ||
        addrString[addrStrLen-1] == chDash)
        return false;

    // rightmost domain label starting with digit indicates IP address
    // since top level domain label can only start with an alpha
    // see RFC 2396 Section 3.2.2

    int lastPeriodPos = XMLString::lastIndexOf(addrString, chPeriod);

    // if the string ends with "."
    // get the second last "."
    if (XMLSize_t(lastPeriodPos + 1) == addrStrLen)
    {
        XMLCh* tmp2 = (XMLCh*) manager->allocate
        (
            addrStrLen * sizeof(XMLCh)
        );//new XMLCh[addrStrLen];
        XMLString::subString(tmp2, addrString, 0, lastPeriodPos, manager);
        lastPeriodPos = XMLString::lastIndexOf(tmp2, chPeriod);
        manager->deallocate(tmp2);//delete [] tmp2;

        if ( XMLString::isDigit(addrString[lastPeriodPos + 1]))
			return false;
    }

    if (XMLString::isDigit(addrString[lastPeriodPos + 1]))
    {
        return isWellFormedIPv4Address(addrString, addrStrLen);
    } // end of IPv4address
    else
    {
        //
        //  hostname      = *( domainlabel "." ) toplabel [ "." ]
        //  domainlabel   = alphanum | alphanum *( alphanum | "-" ) alphanum
        //  toplabel      = alpha | alpha *( alphanum | "-" ) alphanum

        // RFC 2396 states that hostnames take the form described in
        // RFC 1034 (Section 3) and RFC 1123 (Section 2.1). According
        // to RFC 1034, hostnames are limited to 255 characters.
        if (addrStrLen > 255) {
            return false;
        }

        unsigned int labelCharCount = 0;

        // domain labels can contain alphanumerics and '-"
        // but must start and end with an alphanumeric
        for (XMLSize_t i = 0; i < addrStrLen; i++)
        {
            if (addrString[i] == chPeriod)
            {
              if (((i > 0)  &&
                   (!XMLString::isAlphaNum(addrString[i-1]))) ||
                  ((i + 1 < addrStrLen) &&
                   (!XMLString::isAlphaNum(addrString[i+1])))  )
                {
                    return false;
                }
                labelCharCount = 0;
            }
            else if (!XMLString::isAlphaNum(addrString[i]) &&
                      addrString[i] != chDash)
            {
                return false;
            }
            // RFC 1034: Labels must be 63 characters or less.
            else if (++labelCharCount > 63) {
                return false;
            }
        } //for
    }

    return true;
}